

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::setR2EncryptionParametersInsecure
          (QPDFWriter *this,char *user_password,char *owner_password,bool allow_print,
          bool allow_modify,bool allow_extract,bool allow_annotate)

{
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar1;
  value_type_conflict3 local_b4;
  _Base_ptr local_b0;
  undefined1 local_a8;
  value_type_conflict3 local_9c;
  _Base_ptr local_98;
  undefined1 local_90;
  value_type_conflict3 local_84;
  _Base_ptr local_80;
  undefined1 local_78;
  value_type_conflict3 local_5c;
  undefined1 local_58 [8];
  set<int,_std::less<int>,_std::allocator<int>_> clear;
  bool allow_annotate_local;
  bool allow_extract_local;
  bool allow_modify_local;
  bool allow_print_local;
  char *owner_password_local;
  char *user_password_local;
  QPDFWriter *this_local;
  
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = allow_annotate;
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = allow_extract;
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = allow_modify;
  clear._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = allow_print;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  if ((clear._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    local_5c = 3;
    pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58,&local_5c);
    local_80 = (_Base_ptr)pVar1.first._M_node;
    local_78 = pVar1.second;
  }
  if ((clear._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) == 0) {
    local_84 = 4;
    pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58,&local_84);
    local_98 = (_Base_ptr)pVar1.first._M_node;
    local_90 = pVar1.second;
  }
  if ((clear._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ & 1) == 0) {
    local_9c = 5;
    pVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58,&local_9c);
    local_b0 = (_Base_ptr)pVar1.first._M_node;
    local_a8 = pVar1.second;
  }
  if ((clear._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ & 1) == 0) {
    local_b4 = 6;
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58,&local_b4);
  }
  setEncryptionParameters
            (this,user_password,owner_password,1,2,5,
             (set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_58);
  return;
}

Assistant:

void
QPDFWriter::setR2EncryptionParametersInsecure(
    char const* user_password,
    char const* owner_password,
    bool allow_print,
    bool allow_modify,
    bool allow_extract,
    bool allow_annotate)
{
    std::set<int> clear;
    if (!allow_print) {
        clear.insert(3);
    }
    if (!allow_modify) {
        clear.insert(4);
    }
    if (!allow_extract) {
        clear.insert(5);
    }
    if (!allow_annotate) {
        clear.insert(6);
    }

    setEncryptionParameters(user_password, owner_password, 1, 2, 5, clear);
}